

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgraphel1d.cpp
# Opt level: O0

int __thiscall TPZGraphEl1d::NPoints(TPZGraphEl1d *this,TPZGraphNode *n)

{
  uint uVar1;
  int iVar2;
  TPZGraphEl *in_RSI;
  long in_RDI;
  int res;
  int in;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 local_4;
  
  uVar1 = TPZGraphEl::ConnectNum
                    (in_RSI,(TPZGraphNode *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  iVar2 = TPZGraphMesh::Res(*(TPZGraphMesh **)(in_RDI + 0x10));
  if (uVar1 < 2) {
    local_4 = 1;
  }
  else if (uVar1 == 2) {
    local_4 = (1 << ((byte)iVar2 & 0x1f)) + -1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int TPZGraphEl1d::NPoints(TPZGraphNode *n)
{
	int in = ConnectNum(n);
	int res = fGraphMesh->Res();
	switch(in)
	{
		case 0:
		case 1:
			return(1);
		case 2:
			return((1 << res)-1);
	};
	return(0);
}